

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ctsa.c
# Opt level: O2

void auto_arima_summary(auto_arima_object obj)

{
  double dVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  char *pcVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  long lVar11;
  char *pcVar12;
  double dVar13;
  
  iVar8 = obj->q;
  iVar10 = obj->p;
  iVar2 = obj->P;
  iVar3 = obj->Q;
  iVar4 = obj->M;
  iVar5 = obj->r;
  if ((uint)obj->method < 2) {
    puts("\n\nExit Status ");
    printf("Return Code : %d \n",(ulong)(uint)obj->retval);
    printf("Exit Message : ");
    uVar6 = obj->retval;
    if (((ulong)uVar6 < 0x10) && ((0x9493U >> (uVar6 & 0x1f) & 1) != 0)) {
      printf((&PTR_anon_var_dwarf_884_00158d10)[uVar6]);
    }
  }
  puts("\n");
  iVar9 = 0;
  printf("ARIMA Seasonal Order : ( %d, %d, %d) * (%d, %d, %d) \n",(ulong)(uint)obj->p,
         (ulong)(uint)obj->d,(ulong)(uint)obj->q,(ulong)(uint)obj->P,(ulong)(uint)obj->D,obj->Q);
  putchar(10);
  printf("%-20s%-20s%-20s \n\n","Coefficients","Value","Standard Error");
  iVar8 = iVar8 + iVar10 + iVar2 + iVar3 + iVar4 + 1;
  for (lVar11 = 0; lVar11 < obj->p; lVar11 = lVar11 + 1) {
    dVar1 = obj->phi[lVar11];
    if (obj->vcov[iVar9] < 0.0) {
      sqrt(obj->vcov[iVar9]);
    }
    printf("AR%-15d%-20g%-20g \n",dVar1,(ulong)((int)lVar11 + 1));
    iVar9 = iVar9 + iVar8;
  }
  for (lVar11 = 0; lVar11 < obj->q; lVar11 = lVar11 + 1) {
    dVar1 = obj->theta[lVar11];
    if (obj->vcov[(obj->p + (int)lVar11) * iVar8] < 0.0) {
      sqrt(obj->vcov[(obj->p + (int)lVar11) * iVar8]);
    }
    printf("MA%-15d%-20g%-20g \n",dVar1,(ulong)((int)lVar11 + 1));
  }
  for (lVar11 = 0; lVar11 < obj->P; lVar11 = lVar11 + 1) {
    dVar1 = obj->PHI[lVar11];
    if (obj->vcov[(obj->p + obj->q + (int)lVar11) * iVar8] < 0.0) {
      sqrt(obj->vcov[(obj->p + obj->q + (int)lVar11) * iVar8]);
    }
    printf("SAR%-14d%-20g%-20g \n",dVar1,(ulong)((int)lVar11 + 1));
  }
  for (lVar11 = 0; lVar11 < obj->Q; lVar11 = lVar11 + 1) {
    dVar1 = obj->THETA[lVar11];
    if (obj->vcov[(obj->p + obj->q + obj->P + (int)lVar11) * iVar8] < 0.0) {
      sqrt(obj->vcov[(obj->p + obj->q + obj->P + (int)lVar11) * iVar8]);
    }
    printf("SMA%-14d%-20g%-20g \n",dVar1,(ulong)((int)lVar11 + 1));
  }
  putchar(10);
  iVar10 = obj->q + obj->p + obj->P + obj->Q;
  dVar1 = obj->mean;
  if (iVar5 < iVar4) {
    if (obj->vcov[iVar10 * iVar8] < 0.0) {
      sqrt(obj->vcov[iVar10 * iVar8]);
    }
    printf("%-17s%-20g%-20g \n",dVar1,"MEAN");
    iVar10 = iVar10 + 1;
  }
  else {
    printf("%-17s%-20g \n",dVar1,"MEAN");
  }
  if (obj->idrift == 1) {
    dVar1 = *obj->exog;
    dVar13 = obj->vcov[iVar10 * iVar8];
    if (dVar13 < 0.0) {
      dVar13 = sqrt(dVar13);
    }
    else {
      dVar13 = SQRT(dVar13);
    }
    printf("%-17s%-20g%-20g \n",dVar1,dVar13,"TREND");
    iVar10 = iVar10 + 1;
    lVar11 = 1;
  }
  else {
    printf("%-17s%-20g \n",0,"TREND");
    lVar11 = 0;
  }
  iVar10 = iVar10 * iVar8;
  for (; lVar11 < obj->r; lVar11 = lVar11 + 1) {
    dVar1 = obj->exog[lVar11];
    dVar13 = obj->vcov[iVar10];
    if (dVar13 < 0.0) {
      dVar13 = sqrt(dVar13);
    }
    else {
      dVar13 = SQRT(dVar13);
    }
    printf("%-17s%-20g%-20g \n",dVar1,dVar13,"EXOG");
    iVar10 = iVar10 + iVar8;
  }
  putchar(10);
  printf("%-17s%-20g \n",obj->sigma2,"SIGMA^2");
  putchar(10);
  printf("ESTIMATION METHOD : ");
  if ((ulong)(uint)obj->method < 3) {
    printf(*(char **)(&DAT_00158d90 + (ulong)(uint)obj->method * 8));
  }
  puts("\n");
  printf("OPTIMIZATION METHOD : ");
  if ((ulong)(uint)obj->optmethod < 8) {
    printf((&PTR_anon_var_dwarf_9fd_00158da8)[(uint)obj->optmethod]);
  }
  puts("\n");
  printf("AIC criterion : %g ",obj->aic);
  puts("\n");
  printf("BIC criterion : %g ",obj->bic);
  puts("\n");
  printf("AICC criterion : %g ",obj->aicc);
  puts("\n");
  if ((uint)obj->method < 3) {
    printf("Log Likelihood : %g ",obj->loglik);
    puts("\n");
  }
  printf("Auto ARIMA Parameters ");
  puts("\n");
  pcVar12 = "FALSE";
  pcVar7 = "FALSE";
  if (obj->approximation == 1) {
    pcVar7 = "TRUE";
  }
  printf("Approximation: %s \n",pcVar7);
  if (obj->stepwise == 1) {
    pcVar12 = "TRUE";
  }
  printf("Stepwise: %s \n",pcVar12);
  return;
}

Assistant:

void auto_arima_summary(auto_arima_object obj) {
	int i, pq,t,ncxreg,mean,drift;
	pq = obj->p + obj->q + obj->P + obj->Q + obj->M;
	mean = obj->M - obj->r;

	if (obj->method == 0 || obj->method == 1) {
		printf("\n\nExit Status \n");
		printf("Return Code : %d \n", obj->retval);
		printf("Exit Message : ");

		if (obj->retval == 0) {
			printf("Input Error");
		}
		else if (obj->retval == 1) {
			printf("Probable Success");
		}
		else if (obj->retval == 4) {
			printf("Optimization Routine didn't converge");
		}
		else if (obj->retval == 7) {
			printf("Exogenous Variables are collinear");
		}
		else if (obj->retval == 10) {
			printf("Nonstationary AR part");
		}
		else if (obj->retval == 12) {
			printf("Nonstationary Seasonal AR part");
		}
		else if (obj->retval == 15) {
			printf("Optimization Routine Encountered Inf/Nan Values");
		}
	}
	printf("\n\n");
	printf("ARIMA Seasonal Order : ( %d, %d, %d) * (%d, %d, %d) \n",obj->p,obj->d,obj->q,
	 obj->P,obj->D,obj->Q );
	printf("\n");
	t = 0;

	printf("%-20s%-20s%-20s \n\n", "Coefficients", "Value", "Standard Error");
	for (i = 0; i < obj->p; ++i) {
		printf("AR%-15d%-20g%-20g \n", i + 1, obj->phi[i], sqrt(obj->vcov[i + pq*i]));
	}
	for (i = 0; i < obj->q; ++i) {
		t = obj->p + i;
		printf("MA%-15d%-20g%-20g \n", i + 1, obj->theta[i], sqrt(obj->vcov[t + pq * t]));
	}
	for (i = 0; i < obj->P; ++i) {
		t = obj->p + obj->q + i;
		printf("SAR%-14d%-20g%-20g \n", i + 1, obj->PHI[i], sqrt(obj->vcov[t + pq * t]));
	}
	for (i = 0; i < obj->Q; ++i) {
		t = obj->p + obj->q + obj->P + i;
		printf("SMA%-14d%-20g%-20g \n", i + 1, obj->THETA[i], sqrt(obj->vcov[t + pq * t]));
	}
	printf("\n");
	t = obj->p + obj->q + obj->P + obj->Q;
	if (mean > 0) {
		printf("%-17s%-20g%-20g \n", "MEAN", obj->mean, sqrt(obj->vcov[t + pq * t]));
		t++;
		
	}
	else {
		printf("%-17s%-20g \n", "MEAN", obj->mean);
	}
	ncxreg = 0;
	if (obj->idrift == 1) {
		printf("%-17s%-20g%-20g \n", "TREND", obj->exog[0], sqrt(obj->vcov[t + pq * t]));
		t++;
		ncxreg++;
	} else {
		printf("%-17s%-20g \n", "TREND", 0.0);
	}
	for(i = ncxreg; i < obj->r; ++i) {
		printf("%-17s%-20g%-20g \n", "EXOG", obj->exog[i], sqrt(obj->vcov[t + pq * t]));
		t++;
	}
	printf("\n");
	printf("%-17s%-20g \n", "SIGMA^2", obj->sigma2);
	printf("\n");
	printf("ESTIMATION METHOD : ");
	if (obj->method == 0) {
		printf("CSS-MLE");
	}
	else if (obj->method == 1) {
		printf("MLE");
	}
	else if (obj->method == 2) {
		printf("CSS");
	}
	printf("\n\n");
	printf("OPTIMIZATION METHOD : ");
	
	if (obj->optmethod == 0) {
		printf("Nelder-Mead");
	}
	else if (obj->optmethod == 1) {
		printf("Newton Line Search");
	}
	else if (obj->optmethod == 2) {
		printf("Newton Trust Region - Hook Step");
	}
	else if (obj->optmethod == 3) {
		printf("Newton Trust Region - Double Dog-Leg");
	}
	else if (obj->optmethod == 4) {
		printf("Conjugate Gradient");
	}
	else if (obj->optmethod == 5) {
		printf("BFGS");
	}
	else if (obj->optmethod == 6) {
		printf("L-BFGS");
	}
	else if (obj->optmethod == 7) {
		printf("BFGS More-Thuente Line Search");
	}
	
	printf("\n\n");
	
	printf("AIC criterion : %g ", obj->aic);
	printf("\n\n");
	printf("BIC criterion : %g ", obj->bic);
	printf("\n\n");
	printf("AICC criterion : %g ", obj->aicc);
	printf("\n\n");
	if (obj->method == 0 || obj->method == 1 || obj->method == 2) {
		printf("Log Likelihood : %g ", obj->loglik);
		printf("\n\n");
	}
	printf("Auto ARIMA Parameters ");
	printf("\n\n");
	printf("Approximation: %s \n", obj->approximation == 1 ? "TRUE" : "FALSE");
	printf("Stepwise: %s \n", obj->stepwise == 1 ? "TRUE" : "FALSE");
}